

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall maths::Matrix::rowReduceFromGaussian(Matrix *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *pdVar6;
  double **extraout_RDX;
  double **extraout_RDX_00;
  double **extraout_RDX_01;
  double **ppdVar7;
  Matrix *in_RDI;
  Matrix MVar8;
  int k_1;
  int s;
  int t;
  int k;
  int j;
  int i;
  int cols;
  int rows;
  Matrix *R;
  Matrix *in_stack_fffffffffffffef8;
  Matrix *in_stack_ffffffffffffff00;
  int local_40;
  int local_3c;
  int local_38;
  int local_28;
  int local_24;
  int local_20;
  
  Matrix(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iVar5 = in_RDI->cols_;
  local_24 = iVar5 + -2;
  ppdVar7 = extraout_RDX;
  local_38 = in_RDI->rows_;
  while (local_20 = local_38 + -1, local_28 = local_24, -1 < local_20) {
    while (local_28 = local_28 + -1, -1 < local_28) {
      pdVar6 = operator()(in_RDI,local_20,local_28);
      if ((*pdVar6 != 0.0) || (NAN(*pdVar6))) {
        local_24 = local_28;
      }
    }
    pdVar6 = operator()(in_RDI,local_20,local_24);
    if ((*pdVar6 != 0.0) || (ppdVar7 = extraout_RDX_00, NAN(*pdVar6))) {
      for (local_38 = local_38 + -2; local_40 = local_24, -1 < local_38; local_38 = local_38 + -1) {
        for (local_3c = 0; local_3c < iVar5; local_3c = local_3c + 1) {
          if (local_3c != local_24) {
            pdVar6 = operator()(in_RDI,local_38,local_3c);
            dVar1 = *pdVar6;
            pdVar6 = operator()(in_RDI,local_20,local_3c);
            dVar2 = *pdVar6;
            pdVar6 = operator()(in_RDI,local_38,local_24);
            dVar3 = *pdVar6;
            pdVar6 = operator()(in_RDI,local_20,local_24);
            dVar4 = *pdVar6;
            pdVar6 = operator()(in_RDI,local_38,local_3c);
            *pdVar6 = dVar1 - dVar2 * (dVar3 / dVar4);
            pdVar6 = operator()(in_RDI,local_38,local_3c);
            if ((*pdVar6 <= 1e-10 && *pdVar6 != 1e-10) &&
               (pdVar6 = operator()(in_RDI,local_38,local_3c), -1e-10 < *pdVar6)) {
              pdVar6 = operator()(in_RDI,local_38,local_3c);
              *pdVar6 = 0.0;
            }
          }
        }
        pdVar6 = operator()(in_RDI,local_38,local_24);
        *pdVar6 = 0.0;
      }
      while (local_40 = local_40 + 1, local_40 < iVar5) {
        pdVar6 = operator()(in_RDI,local_20,local_40);
        dVar1 = *pdVar6;
        pdVar6 = operator()(in_RDI,local_20,local_24);
        dVar2 = *pdVar6;
        pdVar6 = operator()(in_RDI,local_20,local_40);
        *pdVar6 = dVar1 / dVar2;
        pdVar6 = operator()(in_RDI,local_20,local_40);
        if ((*pdVar6 <= 1e-10 && *pdVar6 != 1e-10) &&
           (pdVar6 = operator()(in_RDI,local_20,local_40), -1e-10 < *pdVar6)) {
          pdVar6 = operator()(in_RDI,local_20,local_40);
          *pdVar6 = 0.0;
        }
      }
      pdVar6 = operator()(in_RDI,local_20,local_24);
      *pdVar6 = 1.0;
      ppdVar7 = extraout_RDX_01;
    }
    local_24 = local_24 + -1;
    local_38 = local_20;
  }
  MVar8.p = ppdVar7;
  MVar8._0_8_ = in_RDI;
  return MVar8;
}

Assistant:

Matrix Matrix::rowReduceFromGaussian()
{
    Matrix R(*this);
    int rows = R.rows_;
    int cols = R.cols_;

    int i = rows - 1; // row tracker
    int j = cols - 2; // column tracker

    // iterate through every row
    while (i >= 0)
    {
        // find the pivot column
        int k = j - 1;
        while (k >= 0) {
            if (R(i, k) != 0)
                j = k;
            k--;
        }

        // zero out elements above pivots if pivot not 0
        if (R(i, j) != 0) {

            for (int t = i - 1; t >= 0; --t) {
                for (int s = 0; s < cols; ++s) {
                    if (s != j) {
                        R(t, s) = R(t, s) - R(i, s) * (R(t, j) / R(i, j));
                        if (R(t, s) < EPS && R(t, s) > -1*EPS)
                            R(t, s) = 0;
                    }
                }
                R(t, j) = 0;
            }

            // divide row by pivot
            for (int k = j + 1; k < cols; ++k) {
                R(i, k) = R(i, k) / R(i, j);
                if (R(i, k) < EPS && R(i, k) > -1*EPS)
                    R(i, k) = 0;
            }
            R(i, j) = 1;

        }

        i--;
        j--;
    }

    return R;
}